

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

int AF_AActor_A_PlayerScream
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int channel;
  AActor *pAVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  bool bVar5;
  bool local_5f;
  FSoundID local_5c;
  int local_58;
  FSoundID local_54;
  int i;
  FSoundID local_4c;
  int local_48;
  int local_44;
  int chan;
  int sound;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x641,
                  "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar5) {
    _chan = (AActor *)(param->field_0).field_1.a;
    local_5f = true;
    if (_chan != (AActor *)0x0) {
      local_5f = DObject::IsKindOf((DObject *)_chan,AActor::RegistrationInfo.MyClass);
    }
    if (local_5f != false) {
      local_44 = 0;
      local_48 = 2;
      if ((_chan->player == (player_t *)0x0) ||
         (bVar5 = FSoundID::operator!=(&(_chan->DeathSound).super_FSoundID,0), bVar5)) {
        bVar5 = FSoundID::operator!=(&(_chan->DeathSound).super_FSoundID,0);
        pAVar1 = _chan;
        if (bVar5) {
          FSoundID::FSoundID(&local_4c,&(_chan->DeathSound).super_FSoundID);
          S_Sound(pAVar1,2,&local_4c,1.0,1.0);
        }
        else {
          FSoundID::FSoundID((FSoundID *)&i,"*death");
          S_Sound(pAVar1,2,(FSoundID *)&i,1.0,1.0);
        }
      }
      else {
        uVar2 = level.flags >> 0xf;
        uVar3 = FIntCVar::operator_cast_to_int(&dmflags);
        pAVar1 = _chan;
        if ((((uVar2 | uVar3) & 0x18) != 0) && ((_chan->Vel).Z <= -39.0)) {
          FSoundID::FSoundID(&local_54,"*splat");
          local_44 = S_FindSkinnedSound(pAVar1,&local_54);
          local_48 = 4;
        }
        pAVar1 = _chan;
        if ((local_44 == 0) && (_chan->special1 < 10)) {
          pcVar4 = FName::operator_cast_to_char_(&_chan->player->LastDamageType);
          local_44 = S_FindSkinnedSoundEx(pAVar1,"*wimpydeath",pcVar4);
        }
        pAVar1 = _chan;
        if ((local_44 == 0) && (_chan->health < -0x31)) {
          if (-100 < _chan->health) {
            pcVar4 = FName::operator_cast_to_char_(&_chan->player->LastDamageType);
            local_44 = S_FindSkinnedSoundEx(pAVar1,"*crazydeath",pcVar4);
          }
          pAVar1 = _chan;
          if (local_44 == 0) {
            pcVar4 = FName::operator_cast_to_char_(&_chan->player->LastDamageType);
            local_44 = S_FindSkinnedSoundEx(pAVar1,"*xdeath",pcVar4);
            pAVar1 = _chan;
            if (local_44 == 0) {
              pcVar4 = FName::operator_cast_to_char_(&_chan->player->LastDamageType);
              local_44 = S_FindSkinnedSoundEx(pAVar1,"*gibbed",pcVar4);
              local_48 = 4;
            }
          }
        }
        pAVar1 = _chan;
        if (local_44 == 0) {
          pcVar4 = FName::operator_cast_to_char_(&_chan->player->LastDamageType);
          local_44 = S_FindSkinnedSoundEx(pAVar1,"*death",pcVar4);
        }
        if (local_48 != 2) {
          for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
            if ((local_58 != 1) && (local_58 != 2)) {
              S_StopSound(_chan,local_58);
            }
          }
        }
        pAVar1 = _chan;
        channel = local_48;
        FSoundID::FSoundID(&local_5c,local_44);
        S_Sound(pAVar1,channel,&local_5c,1.0,1.0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x641,
                  "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x641,
                "int AF_AActor_A_PlayerScream(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_PlayerScream)
{
	PARAM_SELF_PROLOGUE(AActor);

	int sound = 0;
	int chan = CHAN_VOICE;

	if (self->player == NULL || self->DeathSound != 0)
	{
		if (self->DeathSound != 0)
		{
			S_Sound (self, CHAN_VOICE, self->DeathSound, 1, ATTN_NORM);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, "*death", 1, ATTN_NORM);
		}
		return 0;
	}

	// Handle the different player death screams
	if ((((level.flags >> 15) | (dmflags)) &
		(DF_FORCE_FALLINGZD | DF_FORCE_FALLINGHX)) &&
		self->Vel.Z <= -39)
	{
		sound = S_FindSkinnedSound (self, "*splat");
		chan = CHAN_BODY;
	}

	if (!sound && self->special1<10)
	{ // Wimpy death sound
		sound = S_FindSkinnedSoundEx (self, "*wimpydeath", self->player->LastDamageType);
	}
	if (!sound && self->health <= -50)
	{
		if (self->health > -100)
		{ // Crazy death sound
			sound = S_FindSkinnedSoundEx (self, "*crazydeath", self->player->LastDamageType);
		}
		if (!sound)
		{ // Extreme death sound
			sound = S_FindSkinnedSoundEx (self, "*xdeath", self->player->LastDamageType);
			if (!sound)
			{
				sound = S_FindSkinnedSoundEx (self, "*gibbed", self->player->LastDamageType);
				chan = CHAN_BODY;
			}
		}
	}
	if (!sound)
	{ // Normal death sound
		sound = S_FindSkinnedSoundEx (self, "*death", self->player->LastDamageType);
	}

	if (chan != CHAN_VOICE)
	{
		for (int i = 0; i < 8; ++i)
		{ // Stop most playing sounds from this player.
		  // This is mainly to stop *land from messing up *splat.
			if (i != CHAN_WEAPON && i != CHAN_VOICE)
			{
				S_StopSound (self, i);
			}
		}
	}
	S_Sound (self, chan, sound, 1, ATTN_NORM);
	return 0;
}